

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_go_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc_go *t)

{
  TD_sylvan_gc_go *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  sylvan_gc_go_CALL(w,__dq_head);
  return;
}

Assistant:

VOID_TASK_0(sylvan_gc_go)
{
    sylvan_stats_count(SYLVAN_GC_COUNT);
    sylvan_timer_start(SYLVAN_GC);

    // call pre gc hooks
    for (gc_hook_entry_t e = pregc_list; e != NULL; e = e->next) {
        WRAP(e->cb);
    }

    /*
     * This simply clears the cache.
     * Alternatively, we could implement for example some strategy
     * where part of the cache is cleared and part is marked
     */
    CALL(sylvan_clear_cache);

    CALL(sylvan_clear_and_mark);

    // call hooks for resizing and all that
    WRAP(main_hook);

    CALL(sylvan_rehash_all);

    // call post gc hooks
    for (gc_hook_entry_t e = postgc_list; e != NULL; e = e->next) {
        WRAP(e->cb);
    }

    sylvan_timer_stop(SYLVAN_GC);
}